

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

ImageFeatureType_ImageSizeRange * __thiscall
CoreML::Specification::ImageFeatureType::_internal_mutable_imagesizerange(ImageFeatureType *this)

{
  ulong uVar1;
  ImageFeatureType_EnumeratedImageSizes *pIVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x1f) {
    pIVar2 = (this->SizeFlexibility_).enumeratedsizes_;
  }
  else {
    clear_SizeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pIVar2 = (ImageFeatureType_EnumeratedImageSizes *)
             google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::ImageFeatureType_ImageSizeRange>(arena);
    (this->SizeFlexibility_).imagesizerange_ = (ImageFeatureType_ImageSizeRange *)pIVar2;
  }
  return (ImageFeatureType_ImageSizeRange *)pIVar2;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType_ImageSizeRange* ImageFeatureType::_internal_mutable_imagesizerange() {
  if (!_internal_has_imagesizerange()) {
    clear_SizeFlexibility();
    set_has_imagesizerange();
    SizeFlexibility_.imagesizerange_ = CreateMaybeMessage< ::CoreML::Specification::ImageFeatureType_ImageSizeRange >(GetArenaForAllocation());
  }
  return SizeFlexibility_.imagesizerange_;
}